

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O1

QString * QSqlQueryModelSql::asc(QString *__return_storage_ptr__,QString *s)

{
  long lVar1;
  Data *pDVar2;
  int *piVar3;
  QString *pQVar4;
  long *plVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QLatin1String QVar7;
  QString local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  long local_20;
  
  pQVar4 = &local_58;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QVar6.m_data = (storage_type *)0x3;
  QVar6.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar6);
  local_58.d.d._0_4_ = (undefined4)local_38;
  local_58.d.d._4_4_ = local_38._4_4_;
  local_58.d.ptr._0_4_ = (undefined4)uStack_30;
  local_58.d.ptr._4_4_ = uStack_30._4_4_;
  local_58.d.size = local_28;
  lVar1 = (s->d).size;
  if ((lVar1 == 0) || (pQVar4 = s, local_28 == 0)) {
    pDVar2 = (pQVar4->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (pQVar4->d).ptr;
    (__return_storage_ptr__->d).size = (pQVar4->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_38 = &((s->d).d)->super_QArrayData;
    uStack_30 = (s->d).ptr;
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar7.m_data = (char *)0x1;
    QVar7.m_size = (qsizetype)&local_38;
    local_28 = lVar1;
    pQVar4 = (QString *)QString::append(QVar7);
    plVar5 = (long *)QString::append(pQVar4);
    pDVar2 = (Data *)*plVar5;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (char16_t *)plVar5[1];
    (__return_storage_ptr__->d).size = plVar5[2];
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,2,0x10);
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline const static QString concat(const QString &a, const QString &b) { return a.isEmpty() ? b : b.isEmpty() ? a : QString(a).append(sp()).append(b); }